

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_byte_array_stop_decode_char
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  cram_block *pcVar4;
  ulong uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar uVar8;
  
  if (slice->block_by_id == (cram_block **)0x0) {
    uVar1 = slice->hdr->num_blocks;
    if ((int)uVar1 < 1) {
      uVar5 = 0;
      pcVar4 = (cram_block *)0x0;
    }
    else {
      uVar5 = 0;
      do {
        pcVar4 = slice->block[uVar5];
        if (((pcVar4 != (cram_block *)0x0) && (pcVar4->content_type == EXTERNAL)) &&
           (pcVar4->content_id == (c->field_6).external.type)) goto LAB_001552d2;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      uVar5 = (ulong)uVar1;
    }
LAB_001552d2:
    if ((uint)uVar5 == uVar1) {
      return -1;
    }
    if (pcVar4 == (cram_block *)0x0) {
      return -1;
    }
  }
  else {
    pcVar4 = slice->block_by_id[(c->field_6).beta.nbits];
    if (pcVar4 == (cram_block *)0x0) {
      return -(uint)(*out_size != 0);
    }
  }
  iVar2 = pcVar4->idx;
  iVar3 = -1;
  if (iVar2 < pcVar4->uncomp_size) {
    puVar7 = pcVar4->data;
    puVar6 = puVar7 + iVar2;
    uVar8 = puVar7[iVar2];
    if (uVar8 != (c->field_6).byte_array_stop.stop) {
      puVar7 = puVar7 + iVar2;
      do {
        if ((long)pcVar4->uncomp_size <= (long)puVar7 - (long)pcVar4->data) {
          return -1;
        }
        *out = uVar8;
        out = (char *)((uchar *)out + 1);
        uVar8 = puVar6[1];
        puVar6 = puVar6 + 1;
        puVar7 = puVar7 + 1;
      } while (uVar8 != (c->field_6).byte_array_stop.stop);
    }
    iVar2 = *(int *)&pcVar4->data;
    *out_size = (int)puVar6 - (pcVar4->idx + iVar2);
    pcVar4->idx = ((int)puVar6 - iVar2) + 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int cram_byte_array_stop_decode_char(cram_slice *slice, cram_codec *c,
					    cram_block *in, char *out,
					    int *out_size) {
    int i;
    cram_block *b = NULL;
    char *cp, ch;

    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->byte_array_stop.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->byte_array_stop.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    if (b->idx >= b->uncomp_size)
	return -1;

    cp = (char *)b->data + b->idx;
    while ((ch = *cp) != (char)c->byte_array_stop.stop) {
	if (cp - (char *)b->data >= b->uncomp_size)
	    return -1;
	*out++ = ch;
	cp++;
    }

    *out_size = cp - (char *)(b->data + b->idx);
    b->idx = cp - (char *)b->data + 1;

    return 0;
}